

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O3

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsLong
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  FieldEncodingEnum FVar1;
  int16_t iVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  ulong value;
  uint64_t uVar7;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar8;
  PriceField PVar9;
  
  FVar1 = field_def->encoding_;
  switch(FVar1) {
  case FIXED1:
    uVar3 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
    value = (ulong)(uVar3 & 0xff);
    break;
  case FIXED2:
    iVar2 = tools::ByteBuffer::ReadShort(buffer);
    value = (ulong)iVar2;
    break;
  case FIXED3:
    iVar5 = tools::ByteBuffer::ReadMedium(buffer);
    goto LAB_001b1158;
  case FIXED4:
    iVar5 = tools::ByteBuffer::ReadInt(buffer);
LAB_001b1158:
    value = (ulong)iVar5;
    break;
  case 0x35:
  case 0x36:
  case 0x37:
switchD_001b10f1_caseD_35:
    uVar4 = tools::Varint::ReadU32(&buffer->super_InputStream);
    tools::ByteBuffer::Seek(buffer,(ulong)uVar4);
    PriceField::PriceField((PriceField *)this);
    aVar8 = extraout_RDX;
    goto LAB_001b1196;
  case FIXED8:
    value = tools::ByteBuffer::ReadLong(buffer);
    break;
  default:
    if (FVar1 == VARINT) {
      uVar6 = tools::Varint::ReadU64(&buffer->super_InputStream);
      uVar7 = EncodingUtil::PowerOfTen(field_def->scale_);
      value = uVar6 * uVar7;
    }
    else {
      if (FVar1 != ZIGZAG) goto switchD_001b10f1_caseD_35;
      uVar6 = tools::Varint::ReadU64(&buffer->super_InputStream);
      value = tools::Varint::ZigzagToLong(uVar6);
    }
  }
  PriceField::PriceField((PriceField *)this,value);
  aVar8 = extraout_RDX_00;
LAB_001b1196:
  PVar9.field_1.long_value_ = aVar8.long_value_;
  PVar9._0_8_ = this;
  return PVar9;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsLong(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED1:
            return PriceField((int64_t) buffer.ReadByte());
        case FIXED2:
            return PriceField((int64_t) buffer.ReadShort());
        case FIXED3:
            return PriceField((int64_t) buffer.ReadMedium());
        case FIXED4:
            return PriceField((int64_t) buffer.ReadInt());
        case FIXED8:
            return PriceField(buffer.ReadLong());
        case VARINT:
            return PriceField((int64_t) (Varint::ReadU64(buffer) * EncodingUtil::PowerOfTen(field_def.scale_)));
        case ZIGZAG:
            return PriceField(static_cast<int64_t>(Varint::ZigzagToLong(tools::Varint::ReadU64(buffer))));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();

}